

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

void lj_func_closeuv(lua_State *L,TValue *level)

{
  global_State *g_00;
  bool bVar1;
  GCobj *o;
  global_State *g;
  GCupval *uv;
  TValue *level_local;
  lua_State *L_local;
  
  g_00 = (global_State *)(L->glref).ptr64;
  while( true ) {
    bVar1 = false;
    if ((L->openupval).gcptr64 != 0) {
      g = (global_State *)(L->openupval).gcptr64;
      bVar1 = level <= *(TValue **)&(g->gc).currentwhite;
    }
    if (!bVar1) break;
    (L->openupval).gcptr64 = (uint64_t)g->allocf;
    if ((*(byte *)&g->allocd & ((g_00->gc).currentwhite ^ 3) & 3) == 0) {
      unlinkuv(g_00,(GCupval *)g);
      lj_gc_closeuv(g_00,(GCupval *)g);
    }
    else {
      lj_func_freeuv(g_00,(GCupval *)g);
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lj_assertG(!isblack(o), "bad black upvalue");
    lj_assertG(!uv->closed && uvval(uv) != &uv->tv, "closed upvalue in chain");
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(g, uv);
      lj_gc_closeuv(g, uv);
    }
  }
}